

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eci.cc
# Opt level: O1

CoordGeodetic * __thiscall Eci::ToGeodetic(CoordGeodetic *__return_storage_ptr__,Eci *this)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_30;
  
  dVar4 = (this->m_position).x;
  dVar7 = (this->m_position).y;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_30 = atan(dVar7 / dVar4);
    if (dVar4 <= 0.0) {
      local_30 = local_30 + 3.141592653589793;
    }
  }
  else {
    local_30 = *(double *)(&DAT_00116070 + (ulong)(0.0 < dVar7) * 8);
  }
  dVar3 = DateTime::ToGreenwichSiderealTime(&this->m_dt);
  dVar4 = (this->m_position).x;
  dVar7 = (this->m_position).y;
  dVar4 = dVar4 * dVar4 + dVar7 * dVar7;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar7 = (this->m_position).z;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar7 = atan(dVar7 / dVar4);
    if (dVar4 <= 0.0) {
      dVar7 = dVar7 + 3.141592653589793;
    }
  }
  else {
    dVar7 = *(double *)(&DAT_00116070 + (ulong)(0.0 < dVar7) * 8);
  }
  uVar1 = 0;
  do {
    dVar5 = sin(dVar7);
    dVar6 = dVar5 * -0.006694317778266723 * dVar5 + 1.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar5 = (1.0 / dVar6) * 6378.135 * 0.006694317778266723 * dVar5 + (this->m_position).z;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar5 = atan(dVar5 / dVar4);
      if (dVar4 <= 0.0) {
        dVar5 = dVar5 + 3.141592653589793;
      }
    }
    else {
      dVar5 = *(double *)(&DAT_00116070 + (ulong)(0.0 < dVar5) * 8);
    }
  } while ((1e-10 <= ABS(dVar5 - dVar7)) &&
          (bVar2 = uVar1 < 9, dVar7 = dVar5, uVar1 = uVar1 + 1, bVar2));
  dVar7 = (local_30 - dVar3) + 3.141592653589793;
  dVar3 = floor(dVar7 / 6.283185307179586);
  dVar8 = cos(dVar5);
  __return_storage_ptr__->latitude = dVar5;
  __return_storage_ptr__->longitude = dVar3 * -6.283185307179586 + dVar7 + -3.141592653589793;
  __return_storage_ptr__->altitude = (1.0 / dVar6) * -6378.135 + dVar4 / dVar8;
  return __return_storage_ptr__;
}

Assistant:

CoordGeodetic Eci::ToGeodetic() const
{
    const double theta = Util::AcTan(m_position.y, m_position.x);

    const double lon = Util::WrapNegPosPI(theta
            - m_dt.ToGreenwichSiderealTime());

    const double r = sqrt((m_position.x * m_position.x)
            + (m_position.y * m_position.y));
    
    static const double e2 = kF * (2.0 - kF);

    double lat = Util::AcTan(m_position.z, r);
    double phi = 0.0;
    double c = 0.0;
    int cnt = 0;

    do
    {
        phi = lat;
        const double sinphi = sin(phi);
        c = 1.0 / sqrt(1.0 - e2 * sinphi * sinphi);
        lat = Util::AcTan(m_position.z + kXKMPER * c * e2 * sinphi, r);
        cnt++;
    }
    while (fabs(lat - phi) >= 1e-10 && cnt < 10);

    const double alt = r / cos(lat) - kXKMPER * c;

    return CoordGeodetic(lat, lon, alt, true);
}